

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createStore(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  Value *pVVar2;
  Type *pTVar3;
  size_type sVar4;
  iterator this_00;
  reference ds_00;
  Type *in_RDI;
  Value *in_stack_00000020;
  Value *in_stack_00000028;
  GenericDefSite<dg::dda::RWNode> *ds_1;
  iterator __end2;
  iterator __begin2;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *__range2;
  GenericDefSite<dg::dda::RWNode> *ds;
  bool strong_update;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  uint64_t size;
  RWNode *node;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  DataLayout *in_stack_ffffffffffffff70;
  __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
  local_68;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *local_60;
  __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
  local_58;
  reference local_50;
  byte local_41;
  Offset local_40;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  local_38;
  uint64_t local_20;
  RWNode *local_18;
  
  local_18 = create((LLVMReadWriteGraphBuilder *)
                    CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    (RWNodeType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  pVVar2 = llvm::User::getOperand
                     ((User *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  pTVar3 = llvm::Value::getType(pVVar2);
  GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
            ((GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *)0x18d78c);
  local_20 = llvmutils::getAllocatedSize(in_RDI,in_stack_ffffffffffffff70);
  if (local_20 == 0) {
    local_20 = Offset::UNKNOWN;
  }
  pVVar2 = llvm::User::getOperand
                     ((User *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  Offset::Offset(&local_40,local_20);
  mapPointers((LLVMReadWriteGraphBuilder *)ds_1,in_stack_00000028,in_stack_00000020,
              (Offset)__end2._M_current);
  local_41 = 0;
  sVar4 = std::
          vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ::size(&local_38);
  if (sVar4 != 1) goto LAB_0018d8af;
  local_58._M_current =
       (GenericDefSite<dg::dda::RWNode> *)
       std::
       vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_50 = __gnu_cxx::
             __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
             ::operator*(&local_58);
  bVar1 = RWNode::isAlloc((RWNode *)0x18d856);
  if (bVar1) {
LAB_0018d876:
    bVar1 = Offset::isUnknown(&local_50->offset);
    in_stack_ffffffffffffff67 = 0;
    if (!bVar1) {
      bVar1 = Offset::isUnknown(&local_50->len);
      in_stack_ffffffffffffff67 = bVar1 ^ 0xff;
    }
  }
  else {
    bVar1 = RWNode::isGlobal((RWNode *)0x18d867);
    in_stack_ffffffffffffff67 = 0;
    if (bVar1) goto LAB_0018d876;
  }
  local_41 = in_stack_ffffffffffffff67 & 1;
LAB_0018d8af:
  local_60 = &local_38;
  local_68._M_current =
       (GenericDefSite<dg::dda::RWNode> *)
       std::
       vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::begin(in_stack_ffffffffffffff58);
  this_00 = std::
            vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            ::end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (__normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    ds_00 = __gnu_cxx::
            __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
            ::operator*(&local_68);
    RWNode::addDef((RWNode *)this_00._M_current,ds_00,SUB81((ulong)pTVar3 >> 0x38,0));
    __gnu_cxx::
    __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
    ::operator++(&local_68);
  }
  std::
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::~vector((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             *)pVVar2);
  return local_18;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createStore(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::STORE);

    uint64_t size = llvmutils::getAllocatedSize(Inst->getOperand(0)->getType(),
                                                getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(1), size);

    // strong update is possible only with must aliases that point
    // to the last instance of the memory object. Since detecting that
    // is not that easy, do strong updates only on must aliases
    // of local and global variables (and, of course, we must know the offsets)
    // FIXME: ALLOCAs in recursive procedures can also yield only weak update
    bool strong_update = false;
    if (defSites.size() == 1) {
        const auto &ds = *(defSites.begin());
        strong_update = (ds.target->isAlloc() || ds.target->isGlobal()) &&
                        !ds.offset.isUnknown() && !ds.len.isUnknown();
    }

    for (const auto &ds : defSites) {
        node.addDef(ds, strong_update);
    }

    return &node;
}